

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool __thiscall
duckdb::Hugeint::TryCast<unsigned_short>(Hugeint *this,hugeint_t input,uint16_t *result)

{
  bool bVar1;
  
  bVar1 = input.lower == 0;
  if (this < (Hugeint *)0x10000 && bVar1) {
    *(short *)input.upper = (short)this;
  }
  return this < (Hugeint *)0x10000 && bVar1;
}

Assistant:

bool HugeintTryCastInteger(hugeint_t input, DST &result) {
	switch (input.upper) {
	case 0:
		// positive number: check if the positive number is in range
		if (input.lower <= uint64_t(NumericLimits<DST>::Maximum())) {
			result = DST(input.lower);
			return true;
		}
		break;
	case -1:
		if (!SIGNED) {
			return false;
		}
		// negative number: check if the negative number is in range
		if (input.lower >= NumericLimits<uint64_t>::Maximum() - uint64_t(NumericLimits<DST>::Maximum())) {
			result = -DST(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}